

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void serveTheDrinks(int bottles,string *beverage)

{
  ostream *poVar1;
  string *beverage_local;
  int bottles_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"here are ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,bottles);
  poVar1 = std::operator<<(poVar1," bottles of ");
  poVar1 = std::operator<<(poVar1,(string *)beverage);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void serveTheDrinks(int bottles, std::string beverage)
{
    std::cout << "here are " << bottles << " bottles of " << beverage << std::endl;
}